

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialogPrivate::ensureIntSpinBox(QInputDialogPrivate *this)

{
  QWidget *parent;
  QWidget *this_00;
  long in_FS_OFFSET;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->intSpinBox == (QSpinBox *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    this_00 = (QWidget *)operator_new(0x28);
    QInputDialogSpinBox::QInputDialogSpinBox((QInputDialogSpinBox *)this_00,parent);
    this->intSpinBox = (QSpinBox *)this_00;
    QWidget::hide(this_00);
    QObject::connect<void(QSpinBox::*)(int),void(QInputDialog::*)(int)>
              ((Object *)&stack0xffffffffffffffd8,(offset_in_QSpinBox_to_subr)this->intSpinBox,
               (ContextType *)QSpinBox::valueChanged,(offset_in_QInputDialog_to_subr *)0x0,
               (ConnectionType)parent);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureIntSpinBox()
{
    Q_Q(QInputDialog);
    if (!intSpinBox) {
        intSpinBox = new QInputDialogSpinBox(q);
        intSpinBox->hide();
        QObject::connect(intSpinBox, &QInputDialogSpinBox::valueChanged,
                         q, &QInputDialog::intValueChanged);
    }
}